

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

enable_if_t<IteratorRange<const_double_(*)[3],_double[3]>::is_container>
gnuplotio::
deref_and_print<gnuplotio::IteratorRange<double_const(*)[3],double[3]>,gnuplotio::ModeText>
          (gnuplotio *stream,IteratorRange<const_double_(*)[3],_double[3]> *arg)

{
  plotting_empty_container *this;
  bool bVar1;
  subiter_type subrange;
  
  if (arg->it != arg->end) {
    subrange = IteratorRange<const_double_(*)[3],_double[3]>::deref_subiter(arg);
    bVar1 = true;
    while (subrange.it != subrange.end) {
      if (!bVar1) {
        std::operator<<((ostream *)stream," ");
      }
      deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
                (stream,&subrange);
      subrange.it = subrange.it + 1;
      bVar1 = false;
    }
    return;
  }
  this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
  plotting_empty_container::plotting_empty_container(this);
  __cxa_throw(this,&plotting_empty_container::typeinfo,std::length_error::~length_error);
}

Assistant:

bool is_end() const { return it == end; }